

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

bool __thiscall
trieste::detail::InsideStar<2UL>::match(InsideStar<2UL> *this,NodeIt *it,Node *parent,Match *match)

{
  long lVar1;
  element_type *peVar2;
  int iVar3;
  
  do {
    lVar1 = *(long *)&parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
    if (lVar1 == 0) {
      return false;
    }
  } while ((*(TokenDef **)(lVar1 + 0x10) != (this->types)._M_elems[0].def) &&
          (parent = (Node *)(lVar1 + 0x48),
          *(TokenDef **)(lVar1 + 0x10) != (this->types)._M_elems[1].def));
  peVar2 = (this->super_PatternDef).continuation.
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar3 = (*peVar2->_vptr_PatternDef[4])();
    return SUB41(iVar3,0);
  }
  return true;
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        NodeDef* p = &*parent;

        while (p)
        {
          for (const auto& type : types)
            if (p->type() == type)
              return match_continuation(it, parent, match);

          p = p->parent();
        }

        return false;
      }